

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void embree::ISPCScene::updateLight<embree::SceneGraph::DirectionalLight>
               (DirectionalLight *in,Light *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_RDI;
  undefined1 auVar8 [16];
  __m128 mask;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_5b8;
  ulong local_5a8;
  ulong uStackY_5a0;
  undefined8 local_588;
  undefined8 uStackY_580;
  undefined1 *local_578;
  ulong *local_570;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined1 local_448 [16];
  undefined4 local_42c;
  undefined1 local_428 [16];
  undefined4 local_40c;
  undefined1 local_408 [16];
  float local_3ec;
  ulong local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  ulong local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  ulong local_328;
  undefined8 uStack_320;
  ulong local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 *local_268;
  undefined1 *local_260;
  undefined8 *local_258;
  undefined1 *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  void *pvStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_24;
  undefined1 *local_20;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  float local_4;
  
  local_250 = (undefined1 *)&local_5b8;
  local_230 = (undefined1 *)&local_5b8;
  local_578 = (undefined1 *)&local_5b8;
  local_458 = (undefined8 *)(in_RDI + 0x10);
  local_2b0 = &local_468;
  uVar1 = *local_458;
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  uVar3 = *local_458;
  uVar4 = *(undefined8 *)(in_RDI + 0x18);
  local_38._0_4_ = (float)uVar1;
  local_38._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_30._0_4_ = (float)uVar2;
  uStack_30._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_48._0_4_ = (float)uVar3;
  local_48._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_40._0_4_ = (float)uVar4;
  uStack_40._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_278 = (float)local_38 * (float)local_48;
  fStack_274 = local_38._4_4_ * local_48._4_4_;
  fStack_270 = (float)uStack_30 * (float)uStack_40;
  fStack_26c = uStack_30._4_4_ * uStack_40._4_4_;
  local_228 = CONCAT44(fStack_274,local_278);
  uStack_220 = CONCAT44(fStack_26c,fStack_270);
  local_218 = &local_2c8;
  local_208 = &local_2d8;
  local_168 = CONCAT44(fStack_274,fStack_274);
  uStack_160 = CONCAT44(fStack_274,fStack_274);
  local_1f8 = &local_2e8;
  local_e8 = CONCAT44(fStack_270,fStack_270);
  uStack_e0 = CONCAT44(fStack_270,fStack_270);
  local_1e8 = &local_308;
  local_1a8 = local_278 + fStack_274;
  fStack_1a4 = fStack_274 + fStack_274;
  fStack_1a0 = fStack_270 + fStack_274;
  fStack_19c = fStack_26c + fStack_274;
  local_78 = CONCAT44(fStack_1a4,local_1a8);
  uStack_70 = CONCAT44(fStack_19c,fStack_1a0);
  local_1e0 = &local_2f8;
  local_3ec = local_1a8 + fStack_270;
  fStack_1d4 = fStack_1a4 + fStack_270;
  fStack_1d0 = fStack_1a0 + fStack_270;
  fStack_1cc = fStack_19c + fStack_270;
  local_2a8 = CONCAT44(fStack_1d4,local_3ec);
  uStack_2a0 = CONCAT44(fStack_1cc,fStack_1d0);
  local_408 = ZEXT416((uint)local_3ec);
  local_3e8 = CONCAT44(0,local_3ec);
  uStack_3e0 = 0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_3e8;
  auVar8 = rsqrtss(auVar8,auVar8);
  local_40c = 0x3fc00000;
  local_428 = ZEXT416(0x3fc00000);
  local_498 = auVar8._0_8_;
  uStack_490 = auVar8._8_8_;
  local_338 = local_498;
  uVar7 = local_338;
  uStack_330 = uStack_490;
  local_338._0_4_ = auVar8._0_4_;
  local_328 = (ulong)(uint)((float)local_338 * 1.5);
  uStack_320 = 0;
  local_42c = 0xbf000000;
  local_448 = ZEXT416(0xbf000000);
  local_358 = local_448._0_8_;
  uStack_350 = 0;
  local_348 = (ulong)(uint)(local_3ec * -0.5);
  uStack_340 = 0;
  local_378 = local_498;
  uStack_370 = uStack_490;
  local_24 = local_3ec * -0.5 * (float)local_338;
  local_368 = (ulong)(uint)local_24;
  uStack_360 = 0;
  local_398 = local_498;
  uStack_390 = uStack_490;
  local_388 = CONCAT44(auVar8._4_4_,(float)local_338 * (float)local_338);
  uStack_380 = uStack_490;
  local_3b8 = local_388;
  uStack_3b0 = uStack_490;
  local_24 = local_24 * (float)local_338 * (float)local_338;
  local_3a8 = (ulong)(uint)local_24;
  uStack_3a0 = 0;
  local_3d8 = local_3a8;
  uStack_3d0 = 0;
  local_24 = (float)local_338 * 1.5 + local_24;
  local_3c8 = (ulong)(uint)local_24;
  uStack_3c0 = 0;
  local_318 = local_3c8;
  uStack_310 = 0;
  local_260 = &stack0xfffffffffffffaa8;
  pvStack_60 = (void *)CONCAT44(local_24,local_24);
  uVar5 = *local_458;
  uVar6 = *(undefined8 *)(in_RDI + 0x18);
  local_58._0_4_ = (float)uVar5;
  local_58._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_50._0_4_ = (float)uVar6;
  uStack_50._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_248 = (float)local_58 * local_24;
  fStack_244 = local_58._4_4_ * local_24;
  fStack_240 = (float)uStack_50 * local_24;
  fStack_23c = uStack_50._4_4_ * local_24;
  local_5b8._0_8_ = CONCAT44(fStack_244,local_248);
  local_5b8._8_8_ = CONCAT44(fStack_23c,fStack_240);
  local_570 = &local_5a8;
  local_588 = 0x8000000080000000;
  uStackY_580 = 0x8000000080000000;
  local_5a8 = local_5b8._0_8_ ^ 0x8000000080000000;
  uStackY_5a0 = local_5b8._8_8_ ^ 0x8000000080000000;
  local_450 = local_458;
  local_338 = uVar7;
  local_290 = local_458;
  local_288 = local_458;
  local_280 = local_2b0;
  local_268 = local_2b0;
  local_258 = local_458;
  local_210 = local_218;
  local_200 = local_218;
  local_1f0 = local_1f8;
  local_1d8 = local_3ec;
  local_1c8 = local_1e0;
  local_1c0 = local_208;
  local_1b8 = local_218;
  local_1b0 = local_1e8;
  local_198 = local_1e8;
  local_190 = local_1e0;
  local_188 = local_218;
  local_180 = local_208;
  local_178 = fStack_274;
  fStack_174 = fStack_274;
  fStack_170 = fStack_274;
  fStack_16c = fStack_274;
  local_150 = local_208;
  local_148 = local_228;
  uStack_140 = uStack_220;
  local_130 = local_218;
  local_128 = local_208;
  local_120 = local_218;
  local_118 = local_1f8;
  local_110 = local_1e8;
  local_108 = local_218;
  local_100 = local_1f8;
  local_f8 = fStack_270;
  fStack_f4 = fStack_270;
  fStack_f0 = fStack_270;
  fStack_ec = fStack_270;
  local_d0 = local_1f8;
  local_c8 = local_228;
  uStack_c0 = uStack_220;
  local_b0 = local_218;
  local_a8 = local_168;
  uStack_a0 = uStack_160;
  local_98 = local_228;
  uStack_90 = uStack_220;
  local_88 = local_e8;
  uStack_80 = uStack_e0;
  local_58 = uVar5;
  uStack_50 = uVar6;
  local_48 = uVar3;
  uStack_40 = uVar4;
  local_38 = uVar1;
  uStack_30 = uVar2;
  local_20 = local_260;
  local_18 = local_24;
  fStack_14 = local_24;
  fStack_10 = local_24;
  fStack_c = local_24;
  local_4 = local_24;
  local_468 = local_228;
  uStack_460 = uStack_220;
  local_308 = local_78;
  uStack_300 = uStack_70;
  local_2f8 = local_2a8;
  uStack_2f0 = uStack_2a0;
  local_2e8 = local_e8;
  uStack_2e0 = uStack_e0;
  local_2d8 = local_168;
  uStack_2d0 = uStack_160;
  local_2c8 = local_228;
  uStack_2c0 = uStack_220;
  DirectionalLight_set
            (pvStack_60,(Vec3fa *)CONCAT44(local_24,local_24),(Vec3fa *)&local_5b8.field_1,
             (float)((ulong)local_458 >> 0x20));
  return;
}

Assistant:

void ISPCScene::updateLight(const SceneGraph::DirectionalLight& in, Light* out) {
    DirectionalLight_set(out, -normalize(in.D), in.E, 1.0f);
  }